

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

ImportInfo * __thiscall cmGeneratorTarget::GetImportInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType TVar3;
  iterator iVar4;
  ImportInfo *pIVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_bool>
  pVar6;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_280;
  ImportInfo local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
  local_150;
  
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    paVar1 = &local_280.field_2;
    local_280._M_string_length = 0;
    local_280.field_2._M_local_buf[0] = '\0';
    local_280._M_dataplus._M_p = (pointer)paVar1;
    if (config->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,0x51aecd);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_150.first,config);
      std::__cxx11::string::operator=((string *)&local_280,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.first._M_dataplus._M_p != &local_150.first.field_2) {
        operator_delete(local_150.first._M_dataplus._M_p,
                        local_150.first.field_2._M_allocated_capacity + 1);
      }
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
            ::find(&(this->ImportInfoMap)._M_t,&local_280);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_260.Location._M_dataplus._M_p = (pointer)&local_260.Location.field_2;
      local_260.NoSOName = false;
      local_260.Managed = Native;
      local_260.Multiplicity = 0;
      local_260.Location._M_string_length = 0;
      local_260.Location.field_2._M_local_buf[0] = '\0';
      local_260.SOName._M_dataplus._M_p = (pointer)&local_260.SOName.field_2;
      local_260.SOName._M_string_length = 0;
      local_260.SOName.field_2._M_local_buf[0] = '\0';
      local_260.ImportLibrary._M_dataplus._M_p = (pointer)&local_260.ImportLibrary.field_2;
      local_260.ImportLibrary._M_string_length = 0;
      local_260.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_260.LibName._M_dataplus._M_p = (pointer)&local_260.LibName.field_2;
      local_260.LibName._M_string_length = 0;
      local_260.LibName.field_2._M_local_buf[0] = '\0';
      local_260.Languages._M_dataplus._M_p = (pointer)&local_260.Languages.field_2;
      local_260.Languages._M_string_length = 0;
      local_260.Languages.field_2._M_local_buf[0] = '\0';
      local_260.Libraries._M_dataplus._M_p = (pointer)&local_260.Libraries.field_2;
      local_260.Libraries._M_string_length = 0;
      local_260.Libraries.field_2._M_local_buf[0] = '\0';
      local_260.LibrariesProp._M_dataplus._M_p = (pointer)&local_260.LibrariesProp.field_2;
      local_260.LibrariesProp._M_string_length = 0;
      local_260.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_260.SharedDeps._M_dataplus._M_p = (pointer)&local_260.SharedDeps.field_2;
      local_260.SharedDeps._M_string_length = 0;
      local_260.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_280,&local_260);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ImportInfo_&,_true>
                (&local_150,&local_280,&local_260);
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
              ::
              _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
                          *)&this->ImportInfoMap,&local_150);
      iVar4._M_node = (_Base_ptr)pVar6.first._M_node;
      ImportInfo::~ImportInfo(&local_150.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.first._M_dataplus._M_p != &local_150.first.field_2) {
        operator_delete(local_150.first._M_dataplus._M_p,
                        local_150.first.field_2._M_allocated_capacity + 1);
      }
      ImportInfo::~ImportInfo(&local_260);
    }
    TVar3 = cmTarget::GetType(this->Target);
    if (((TVar3 == INTERFACE_LIBRARY) || (iVar4._M_node[2]._M_right != (_Base_ptr)0x0)) ||
       (iVar4._M_node[4]._M_right != (_Base_ptr)0x0)) {
      pIVar5 = (ImportInfo *)(iVar4._M_node + 2);
    }
    else {
      pIVar5 = (ImportInfo *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p,
                      CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                               local_280.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    pIVar5 = (ImportInfo *)0x0;
  }
  return pIVar5;
}

Assistant:

cmGeneratorTarget::ImportInfo const* cmGeneratorTarget::GetImportInfo(
  const std::string& config) const
{
  // There is no imported information for non-imported targets.
  if (!this->IsImported()) {
    return nullptr;
  }

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  } else {
    config_upper = "NOCONFIG";
  }

  ImportInfoMapType::const_iterator i = this->ImportInfoMap.find(config_upper);
  if (i == this->ImportInfoMap.end()) {
    ImportInfo info;
    this->ComputeImportInfo(config_upper, info);
    ImportInfoMapType::value_type entry(config_upper, info);
    i = this->ImportInfoMap.insert(entry).first;
  }

  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return &i->second;
  }
  // If the location is empty then the target is not available for
  // this configuration.
  if (i->second.Location.empty() && i->second.ImportLibrary.empty()) {
    return nullptr;
  }

  // Return the import information.
  return &i->second;
}